

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
QPDFJob::handlePageSpecs
          (QPDFJob *this,QPDF *pdf,
          vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
          *page_heap)

{
  pointer *__args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  element_type *peVar3;
  pointer pPVar4;
  char *__s;
  char *pcVar5;
  size_t sVar6;
  size_t __n;
  QPDF *this_00;
  pointer puVar7;
  pointer puVar8;
  unsigned_long *__args;
  iterator __position;
  pointer piVar9;
  pointer pcVar10;
  pointer pQVar11;
  QPDFObjectHandle *pQVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  size_type sVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pointer pQVar16;
  QPDFPageData *pQVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  mapped_type *ppQVar21;
  const_iterator cVar22;
  ClosedFileInputSource *pCVar23;
  ClosedFileInputSource *this_02;
  QPDFObjGen *pQVar24;
  mapped_type *ppCVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_00;
  pointer pQVar26;
  const_iterator cVar27;
  mapped_type_conflict1 *pmVar28;
  _Base_ptr p_Var29;
  ulong uVar30;
  QPDFObjGen __result;
  pointer pQVar31;
  QPDFObjGen QVar32;
  pointer pQVar33;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_03;
  const_iterator cVar34;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_04;
  _Base_ptr p_Var35;
  reference this_05;
  undefined8 extraout_RAX;
  _Base_ptr p_Var36;
  _Tp_alloc_type *__alloc;
  _Rb_tree_header *p_Var37;
  QPDFPageData *pQVar38;
  long start_idx;
  uint uVar39;
  PageSpec *page_spec;
  pointer pPVar40;
  element_type *password;
  long lVar41;
  pointer pQVar42;
  _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  *this_06;
  _Alloc_hider _Var43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ulong uVar44;
  QPDFObjGen QVar45;
  ulong uVar46;
  _Rb_tree_header *p_Var47;
  QPDFJob *pQVar48;
  pointer pQVar49;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  int pageno;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cur_page;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  parsed_specs;
  QPDFObjectHandle fields;
  QPDFPageLabelDocumentHelper pldh;
  QPDFObjectHandle new_fields;
  unsigned_long_long from_uuid;
  QPDFObjectHandle new_page;
  QPDFObjGen to_copy_og;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> orig_pages;
  set<int,_std::less<int>,_std::allocator<int>_> selected_from_orig;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_labels;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  page_spec_qpdfs;
  QPDFPageDocumentHelper dh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  page_spec_cfis;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> referenced_fields;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh_map;
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  remove_unreferenced;
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  copied_pages;
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_508;
  element_type *local_500;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f8;
  pointer local_4f0;
  QPDFObjectHandle *local_4e8;
  int local_4dc;
  QPDFJob *local_4d8;
  QPDFFormFieldObjectHelper local_4d0;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  local_498;
  pointer local_478;
  QPDFObjGen local_470;
  QPDFPageData *local_468;
  QPDFPageData *local_460;
  ClosedFileInputSource *local_458;
  QPDFObjectHandle local_450 [2];
  string local_430;
  QPDFObjectHandle local_410 [2];
  pointer local_3e8;
  unsigned_long_long local_3e0;
  QPDFArrayItems local_3d8 [2];
  QPDFObjGen local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  QPDFObjGen local_3a8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_3a0;
  _Any_data local_388;
  code *local_378;
  code *pcStack_370;
  _Any_data local_368;
  code *local_358;
  code *pcStack_350;
  QPDFObjGen local_348;
  QPDFObjGen local_340;
  QPDFObjectHandle local_338;
  QPDFObjectHandle local_328;
  QPDFObjectHandle local_318;
  shared_ptr<InputSource> local_308;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2f8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  local_2a8;
  QPDFPageObjectHelper local_278;
  QPDFObjectHandle local_240;
  QPDFPageDocumentHelper local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  local_210;
  QPDFPageObjectHelper local_1e0;
  QPDFPageObjectHelper local_1a8;
  QPDFPageObjectHelper local_170;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_f0;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  local_c0;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  local_90;
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  local_60;
  
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar4 = *(pointer *)
            ((long)&(peVar3->page_specs).
                    super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                    _M_impl.super__Vector_impl_data + 8);
  local_4d8 = this;
  local_4e8 = (QPDFObjectHandle *)pdf;
  local_458 = (ClosedFileInputSource *)page_heap;
  for (pPVar40 = (peVar3->page_specs).
                 super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
                 super__Vector_impl_data._M_start; pPVar40 != pPVar4; pPVar40 = pPVar40 + 1) {
    iVar20 = std::__cxx11::string::compare((char *)pPVar40);
    if (iVar20 == 0) {
      __s = (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar5 = (char *)(pPVar40->filename)._M_string_length;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strlen(__s);
      this = local_4d8;
      std::__cxx11::string::_M_replace((ulong)pPVar40,0,pcVar5,(ulong)__s);
    }
    if ((pPVar40->range)._M_string_length == 0) {
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      std::__cxx11::string::_M_replace((ulong)&pPVar40->range,0,(char *)0x0,0x2681e9);
    }
  }
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->keep_files_open_set == false) {
    local_518._8_8_ = local_528 + 8;
    local_528._8_8_ = local_528._8_8_ & 0xffffffff00000000;
    local_518._M_allocated_capacity._0_4_ = 0;
    local_518._M_allocated_capacity._4_4_ = 0;
    local_500 = (element_type *)0x0;
    pPVar4 = *(pointer *)
              ((long)&(peVar3->page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
    local_508._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._8_8_;
    for (pPVar40 = (peVar3->page_specs).
                   super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl
                   .super__Vector_impl_data._M_start; pPVar40 != pPVar4; pPVar40 = pPVar40 + 1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_528,&pPVar40->filename);
    }
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->keep_files_open = local_500 <= (element_type *)peVar3->keep_files_open_threshold;
    local_118._8_8_ = 0;
    pcStack_100 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
                ::_M_manager;
    local_118._M_unused._0_8_ = (undefined8)this;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_118);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_528);
  }
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210._M_impl.super__Rb_tree_header._M_header;
  local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_528,
             (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (allocator<char> *)&local_4d0);
  ppQVar21 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                           *)&local_2a8,(key_type *)local_528);
  *ppQVar21 = (mapped_type)local_4e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._0_8_ != &local_518) {
    operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
  }
  local_498.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pQVar38 = (QPDFPageData *)
            (peVar3->page_specs).
            super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_460 = *(QPDFPageData **)
               ((long)&(peVar3->page_specs).
                       super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                       _M_impl.super__Vector_impl_data + 8);
  pQVar17 = pQVar38;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pQVar38 != local_460) {
    do {
      local_468 = pQVar17;
      local_4f0 = pQVar38;
      cVar22 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
               ::find(&local_2a8,&pQVar38->filename);
      pQVar48 = local_4d8;
      pQVar33 = local_4f0;
      if ((_Rb_tree_header *)cVar22._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
        password = (((shared_ptr<char> *)&local_4f0->qpdf)->
                   super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar3 = (local_4d8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sVar6 = (peVar3->encryption_file)._M_string_length;
        if (password == (element_type *)0x0 && sVar6 != 0) {
          __n = (local_4f0->filename)._M_string_length;
          if ((__n == sVar6) &&
             ((__n == 0 ||
              (iVar20 = bcmp((local_4f0->filename)._M_dataplus._M_p,
                             (peVar3->encryption_file)._M_dataplus._M_p,__n), iVar20 == 0)))) {
            password = (peVar3->encryption_file_password).
                       super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          else {
            password = (char *)0x0;
          }
        }
        local_368._8_8_ = 0;
        local_368._M_unused._M_object = local_468;
        pcStack_350 = std::
                      _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                      ::_M_invoke;
        local_358 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                    ::_M_manager;
        doIfVerbose(pQVar48,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_368);
        if (local_358 != (code *)0x0) {
          (*local_358)(&local_368,&local_368,__destroy_functor);
        }
        if (((pQVar48->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            keep_files_open == false) {
          this_02 = (ClosedFileInputSource *)operator_new(0xe8);
          ClosedFileInputSource::ClosedFileInputSource(this_02,(pQVar33->filename)._M_dataplus._M_p)
          ;
          local_528._0_8_ = this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ClosedFileInputSource*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8),this_02);
          QVar45 = (QPDFObjGen)local_528._8_8_;
          pCVar23 = (ClosedFileInputSource *)local_528._0_8_;
          local_528._8_4_ = 0;
          local_528._12_4_ = 0;
          local_528._0_8_ = (pointer)0x0;
          ClosedFileInputSource::stayOpen(this_02,true);
        }
        else {
          pCVar23 = (ClosedFileInputSource *)operator_new(0xd8);
          FileInputSource::FileInputSource
                    ((FileInputSource *)pCVar23,(pQVar33->filename)._M_dataplus._M_p);
          local_528._0_8_ = pCVar23;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInputSource*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8),
                     (FileInputSource *)pCVar23);
          QVar45 = (QPDFObjGen)local_528._8_8_;
          local_528._8_4_ = 0;
          local_528._12_4_ = 0;
          this_02 = (ClosedFileInputSource *)0x0;
          pCVar23 = (ClosedFileInputSource *)local_528._0_8_;
        }
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        if (QVar45 != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)QVar45 + 8) = *(int *)((long)QVar45 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)QVar45 + 8) = *(int *)((long)QVar45 + 8) + 1;
          }
        }
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        local_308.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &pCVar23->super_InputSource;
        local_308.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QVar45;
        processInputSource(pQVar48,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528,
                           &local_308,password,true);
        if ((QPDFObjGen)
            local_308.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_308.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar13 = local_528._0_8_;
        pQVar24 = (QPDFObjGen *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                                *)&local_2a8,&pQVar33->filename);
        uVar14 = local_528._0_8_;
        local_528._0_4_ = (undefined4)uVar13;
        local_528._4_4_ = SUB84(uVar13,4);
        pQVar24->obj = local_528._0_4_;
        pQVar24->gen = local_528._4_4_;
        local_528._0_8_ = uVar14;
        std::
        vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
        ::emplace_back<std::unique_ptr<QPDF,std::default_delete<QPDF>>>
                  ((vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
                    *)local_458,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528);
        if (this_02 != (ClosedFileInputSource *)0x0) {
          ClosedFileInputSource::stayOpen(this_02,false);
          ppCVar25 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                   *)&local_210,&pQVar33->filename);
          *ppCVar25 = this_02;
        }
        std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
                  ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_528);
        if (QVar45 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QVar45);
        }
      }
      __args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                                *)&local_2a8,&pQVar33->filename);
      pQVar42 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pQVar33 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __args_1 = &(local_4f0->orig_pages).
                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (local_498.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_498.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar41 = (long)local_498.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_498.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar41 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        local_478 = local_498.
                    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar44 = (lVar41 >> 3) * 0x2e8ba2e8ba2e8ba3;
        uVar30 = uVar44;
        if (local_498.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_498.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar30 = 1;
        }
        this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   *)(uVar30 + uVar44);
        if ((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             *)0x1745d1745d1745c < this_06) {
          this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     *)0x1745d1745d1745d;
        }
        if (CARRY8(uVar30,uVar44)) {
          this_06 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     *)0x1745d1745d1745d;
        }
        local_470 = (QPDFObjGen)__args_1;
        pQVar26 = std::
                  _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ::_M_allocate(this_06,(size_t)local_4f0);
        QVar45 = local_470;
        std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
        construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                  ((allocator_type *)(lVar41 + (long)pQVar26),local_4f0,__args_00,(QPDF **)local_470
                   ,in_R8);
        pQVar31 = std::
                  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ::_S_relocate(pQVar33,pQVar42,pQVar26,(_Tp_alloc_type *)QVar45);
        pQVar31 = std::
                  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ::_S_relocate(pQVar42,pQVar42,pQVar31 + 1,(_Tp_alloc_type *)QVar45);
        if (pQVar33 != (pointer)0x0) {
          operator_delete(pQVar33,(long)local_478 - (long)pQVar33);
        }
        local_498.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pQVar26 + (long)this_06;
        local_498.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_start = pQVar26;
        local_498.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_finish = pQVar31;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
        construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                  ((allocator_type *)
                   local_498.
                   super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_4f0,__args_00,(QPDF **)__args_1,
                   in_R8);
        local_498.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_finish = pQVar42 + 1;
      }
      pQVar38 = (QPDFPageData *)
                &(local_4f0->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_468 = (QPDFPageData *)
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&local_468->selected_pages + 1);
      pQVar17 = local_468;
    } while (pQVar38 != local_460);
  }
  p_Var47 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var47->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var47->_M_header;
  if ((_Rb_tree_header *)local_2a8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2a8._M_impl.super__Rb_tree_header &&
      ((local_4d8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_unreferenced_page_resources != re_no) {
    p_Var29 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cVar27 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::find(&local_210,(key_type *)(p_Var29 + 1));
      if ((_Rb_tree_header *)cVar27._M_node == &local_210._M_impl.super__Rb_tree_header) {
        pCVar23 = (ClosedFileInputSource *)0x0;
      }
      else {
        ppCVar25 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)&local_210,(key_type *)(p_Var29 + 1));
        pCVar23 = *ppCVar25;
        ClosedFileInputSource::stayOpen(pCVar23,true);
      }
      this_00 = *(QPDF **)(p_Var29 + 2);
      local_528._0_8_ = QPDF::getUniqueId(this_00);
      p_Var36 = &p_Var47->_M_header;
      for (p_Var35 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var35 != (_Rb_tree_header *)0x0;
          p_Var35 = (&p_Var35->_M_left)
                    [(ulong)*(QPDFObjGen *)(p_Var35 + 1) < (ulong)local_528._0_8_]) {
        if ((ulong)*(QPDFObjGen *)(p_Var35 + 1) >= (ulong)local_528._0_8_) {
          p_Var36 = p_Var35;
        }
      }
      p_Var37 = p_Var47;
      if (((_Rb_tree_header *)p_Var36 != p_Var47) &&
         (p_Var37 = (_Rb_tree_header *)p_Var36,
         (ulong)local_528._0_8_ < ((_Rb_tree_header *)p_Var36)->_M_node_count)) {
        p_Var37 = p_Var47;
      }
      if (p_Var37 == p_Var47) {
        bVar18 = shouldRemoveUnreferencedResources(local_4d8,this_00);
        pmVar28 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                *)&local_90,(key_type_conflict *)local_528);
        *pmVar28 = bVar18;
      }
      if (pCVar23 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(pCVar23,false);
      }
      p_Var29 = (_Base_ptr)std::_Rb_tree_increment(p_Var29);
    } while ((_Rb_tree_header *)p_Var29 != &local_2a8._M_impl.super__Rb_tree_header);
  }
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_manager;
  doIfVerbose(local_4d8,
              (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_230,(QPDF *)local_4e8);
  QPDFPageDocumentHelper::getAllPages(&local_3a0,&local_230);
  pQVar16 = local_3a0.
            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pQVar49 = local_3a0.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar49->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar49->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar49->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pQVar49->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_170.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_170.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
      local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pQVar49->m).
               super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pQVar49->m).
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_170.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_170.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_170.m.
                super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      QPDFPageDocumentHelper::removePage(&local_230,&local_170);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_170);
      pQVar49 = pQVar49 + 1;
    } while (pQVar49 != pQVar16);
  }
  pQVar33 = local_498.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pQVar48 = local_4d8;
  peVar3 = (local_4d8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar7 = (peVar3->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = *(pointer *)
            ((long)&(peVar3->collate).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  uVar30 = (long)puVar8 - (long)puVar7 >> 3;
  uVar44 = (long)local_498.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_498.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar46 = ((long)uVar44 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if ((1 < uVar30) && (uVar46 - uVar30 != 0)) {
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_528,
               "--pages: if --collate has more than one value, it must have one value per page specification"
               ,"");
    usage((string *)local_528);
    if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
    }
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528);
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
              ((QPDFPageLabelDocumentHelper *)&local_430);
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
    ::~_Rb_tree(&local_c0);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_2c8);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_2f8);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_3a0);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_230);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector(&local_498);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
    ::~_Rb_tree(&local_210);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
    ::~_Rb_tree(&local_2a8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((puVar8 != puVar7) && (1 < uVar46)) {
    local_528._0_4_ = 0;
    local_528._4_4_ = 0;
    local_528._8_4_ = 0;
    local_528._12_4_ = 0;
    local_518._M_allocated_capacity._0_4_ = 0;
    local_518._M_allocated_capacity._4_4_ = 0;
    lVar41 = uVar46 - uVar30;
    if (uVar30 <= uVar46 && lVar41 != 0) {
      do {
        peVar3 = (pQVar48->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        __args = (peVar3->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             *(pointer *)
              ((long)&(peVar3->collate).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
        if (__position._M_current == __args) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        if (__position._M_current ==
            *(pointer *)
             ((long)&(peVar3->collate).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&peVar3->collate,
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(unsigned_long **)
           ((long)&(peVar3->collate).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8) = __position._M_current + 1;
        }
        lVar41 = lVar41 + -1;
      } while (lVar41 != 0);
    }
    local_2f8._M_impl._0_8_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4d0,uVar46,
               (value_type_conflict4 *)&local_2f8,(allocator_type *)&local_c0);
    local_478 = pQVar33;
    local_458 = (ClosedFileInputSource *)(uVar46 + (uVar46 == 0));
    pCVar23 = (ClosedFileInputSource *)0x0;
    local_3e8 = (pointer)uVar44;
    bVar18 = false;
    do {
      do {
        bVar19 = bVar18;
        peVar3 = (pQVar48->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar41 = (long)(peVar3->collate).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        QVar45 = (QPDFObjGen)local_528._0_8_;
        if ((ClosedFileInputSource *)
            ((long)*(pointer *)
                    ((long)&(peVar3->collate).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8) - lVar41 >> 3) <= pCVar23) {
LAB_0017413f:
          local_528._0_8_ = QVar45;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pCVar23);
        }
        local_4f0 = local_478 + (long)pCVar23;
        uVar30 = 0;
        while (uVar13 = local_528._8_8_, uVar44 = *(ulong *)(lVar41 + (long)pCVar23 * 8),
              uVar30 < uVar44) {
          if ((ClosedFileInputSource *)
              ((long)local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
               (long)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper >> 3) <= pCVar23)
          goto LAB_0017413f;
          uVar44 = *(long *)((long)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper +
                            (long)pCVar23 * 8) + uVar30;
          piVar9 = (local_4f0->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          if (uVar44 < (ulong)((long)(local_4f0->selected_pages).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar9 >> 2)) {
            pQVar38 = (QPDFPageData *)(piVar9 + uVar44);
            if (local_528._8_8_ == local_518._M_allocated_capacity) {
              lVar41 = local_528._8_8_ - (long)QVar45;
              local_468 = pQVar38;
              if (lVar41 == 0x7ffffffffffffff8) {
                local_528._0_8_ = QVar45;
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              local_470.obj = local_518._M_allocated_capacity._0_4_;
              local_470.gen = local_518._M_allocated_capacity._4_4_;
              uVar46 = (lVar41 >> 3) * 0x2e8ba2e8ba2e8ba3;
              uVar44 = uVar46;
              if ((QPDFObjGen)local_528._8_8_ == QVar45) {
                uVar44 = 1;
              }
              pQVar38 = (QPDFPageData *)(uVar44 + uVar46);
              if ((QPDFPageData *)0x1745d1745d1745c < pQVar38) {
                pQVar38 = (QPDFPageData *)0x1745d1745d1745d;
              }
              __alloc = (_Tp_alloc_type *)(uVar44 + uVar46);
              local_460 = (QPDFPageData *)0x1745d1745d1745d;
              if (!CARRY8(uVar44,uVar46)) {
                local_460 = pQVar38;
              }
              __result = (QPDFObjGen)
                         std::
                         _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                         ::_M_allocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                                        *)local_460,(size_t)local_460);
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        ((allocator_type *)(lVar41 + (long)__result),local_4f0,local_468,
                         (int *)__alloc);
              pQVar31 = std::
                        vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ::_S_relocate((pointer)QVar45,(pointer)uVar13,(pointer)__result,__alloc);
              QVar32 = (QPDFObjGen)
                       std::
                       vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ::_S_relocate((pointer)uVar13,(pointer)uVar13,pQVar31 + 1,__alloc);
              if (QVar45 != (QPDFObjGen)0x0) {
                operator_delete((void *)QVar45,(long)local_470 - (long)QVar45);
              }
              local_518._M_allocated_capacity = (long)__result + (long)local_460 * 0x58;
              local_528._8_8_ = QVar32;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        ((allocator_type *)local_528._8_8_,local_4f0,pQVar38,
                         (int *)local_518._M_allocated_capacity);
              __result = QVar45;
              local_528._8_8_ = uVar13 + 0x58;
            }
            bVar19 = true;
            pQVar48 = local_4d8;
            QVar45 = __result;
          }
          uVar30 = uVar30 + 1;
          peVar3 = (pQVar48->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar41 = (long)(peVar3->collate).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if ((ClosedFileInputSource *)
              ((long)*(pointer *)
                      ((long)&(peVar3->collate).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data + 8) - lVar41 >> 3) <= pCVar23)
          goto LAB_0017413f;
        }
        if ((ClosedFileInputSource *)
            ((long)local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
             (long)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper >> 3) <= pCVar23) {
          local_528._0_8_ = QVar45;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pCVar23);
        }
        psVar2 = (string *)
                 ((long)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper + (long)pCVar23 * 8)
        ;
        *(ulong *)psVar2 = *(long *)psVar2 + uVar44;
        pCVar23 = (ClosedFileInputSource *)
                  ((long)&(((_Vector_impl *)&(pCVar23->super_InputSource)._vptr_InputSource)->
                          super__Vector_impl_data)._M_start + 1);
        local_528._0_8_ = QVar45;
        bVar18 = bVar19;
      } while (pCVar23 != local_458);
      pCVar23 = (ClosedFileInputSource *)0x0;
      bVar18 = false;
    } while (bVar19);
    uVar30 = local_528._8_8_ - (long)QVar45;
    if ((ulong)((long)local_498.
                      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_478) < uVar30
       ) {
      pQVar33 = std::
                _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::_M_allocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                               *)(((long)uVar30 >> 3) * 0x2e8ba2e8ba2e8ba3),
                              (size_t)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper);
      local_4f0 = pQVar33;
      pQVar42 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pQVar26 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (; local_498.
             super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             ._M_impl.super__Vector_impl_data._M_start = pQVar42,
          local_498.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_finish = pQVar26, QVar45 != (QPDFObjGen)uVar13;
          QVar45 = (QPDFObjGen)((long)QVar45 + 0x58)) {
        (pQVar33->filename)._M_dataplus._M_p = (pointer)&(pQVar33->filename).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pQVar33,*(long *)QVar45,*(long *)((long)QVar45 + 8) + *(long *)QVar45);
        pQVar33->qpdf = *(QPDF **)((long)QVar45 + 0x20);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  (&pQVar33->orig_pages,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)QVar45 + 0x28));
        std::vector<int,_std::allocator<int>_>::vector
                  (&pQVar33->selected_pages,
                   (vector<int,_std::allocator<int>_> *)((long)QVar45 + 0x40));
        pQVar33 = pQVar33 + 1;
        pQVar42 = local_498.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pQVar26 = local_498.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pQVar42 != pQVar26; pQVar42 = pQVar42 + 1) {
        piVar9 = (pQVar42->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar9 != (pointer)0x0) {
          operator_delete(piVar9,(long)(pQVar42->selected_pages).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar9);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  (&pQVar42->orig_pages);
        pcVar10 = (pQVar42->filename)._M_dataplus._M_p;
        paVar1 = &(pQVar42->filename).field_2;
        if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar10) {
          operator_delete(pcVar10,paVar1->_M_allocated_capacity + 1);
        }
      }
      if (local_498.
          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_498.
                        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_498.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_498.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_498.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_start = local_4f0;
      local_498.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)local_4f0 + uVar30);
    }
    else if (local_3e8 < uVar30) {
      if (0 < (long)local_3e8) {
        lVar41 = (ulong)local_3e8 / 0x58 + 1;
        pQVar33 = local_478;
        do {
          std::__cxx11::string::_M_assign((string *)pQVar33);
          pQVar33->qpdf = *(QPDF **)((long)QVar45 + 0x20);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
                    (&pQVar33->orig_pages,
                     (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)QVar45 + 0x28));
          std::vector<int,_std::allocator<int>_>::operator=
                    (&pQVar33->selected_pages,
                     (vector<int,_std::allocator<int>_> *)((long)QVar45 + 0x40));
          lVar41 = lVar41 + -1;
          pQVar33 = pQVar33 + 1;
          QVar45 = (QPDFObjGen)((long)QVar45 + 0x58);
        } while (1 < lVar41);
      }
      uVar13 = local_528._8_8_;
      local_4f0 = local_498.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pQVar33 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (QVar45 = (QPDFObjGen)
                    ((long)local_498.
                           super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                    (local_528._0_8_ -
                    (long)local_498.
                          super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                          ._M_impl.super__Vector_impl_data._M_start)); QVar45 != (QPDFObjGen)uVar13;
          QVar45 = (QPDFObjGen)((long)QVar45 + 0x58)) {
        (pQVar33->filename)._M_dataplus._M_p = (pointer)&(pQVar33->filename).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pQVar33,*(long *)QVar45,*(long *)((long)QVar45 + 8) + *(long *)QVar45);
        pQVar33->qpdf = *(QPDF **)((long)QVar45 + 0x20);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  (&pQVar33->orig_pages,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)QVar45 + 0x28));
        std::vector<int,_std::allocator<int>_>::vector
                  (&pQVar33->selected_pages,
                   (vector<int,_std::allocator<int>_> *)((long)QVar45 + 0x40));
        pQVar33 = pQVar33 + 1;
      }
    }
    else {
      pQVar42 = local_478;
      pQVar33 = local_498.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (0 < (long)uVar30) {
        lVar41 = uVar30 / 0x58 + 1;
        pQVar33 = local_478;
        do {
          pQVar42 = pQVar33;
          std::__cxx11::string::_M_assign((string *)pQVar42);
          pQVar42->qpdf = *(QPDF **)((long)QVar45 + 0x20);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator=
                    (&pQVar42->orig_pages,
                     (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)QVar45 + 0x28));
          std::vector<int,_std::allocator<int>_>::operator=
                    (&pQVar42->selected_pages,
                     (vector<int,_std::allocator<int>_> *)((long)QVar45 + 0x40));
          lVar41 = lVar41 + -1;
          QVar45 = (QPDFObjGen)((long)QVar45 + 0x58);
          pQVar33 = pQVar42 + 1;
        } while (1 < lVar41);
        pQVar42 = pQVar42 + 1;
        pQVar33 = local_498.
                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pQVar42 != pQVar33; pQVar42 = pQVar42 + 1) {
        piVar9 = (pQVar42->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar9 != (pointer)0x0) {
          operator_delete(piVar9,(long)(pQVar42->selected_pages).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar9);
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  (&pQVar42->orig_pages);
        pcVar10 = (pQVar42->filename)._M_dataplus._M_p;
        paVar1 = &(pQVar42->filename).field_2;
        if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar10) {
          operator_delete(pcVar10,paVar1->_M_allocated_capacity + 1);
        }
      }
    }
    local_498.
    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(uVar30 + (long)local_498.
                                  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    if ((QPDFObjGen)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper != (QPDFObjGen)0x0) {
      operator_delete(local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (long)local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi - (long)local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper);
    }
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
               *)local_528);
  }
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f8._M_impl.super__Rb_tree_header._M_header;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_470 = (QPDFObjGen)
              get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                 *)&local_c0,(QPDF *)local_4e8);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar41 = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8 = local_498.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_498.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_498.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4f0 = (pointer)&PTR__QPDFObjectHelper_002f1ce8;
    uVar39 = 0;
    pQVar33 = local_498.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar27 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::find(&local_210,&pQVar33->filename);
      if ((_Rb_tree_header *)cVar27._M_node == &local_210._M_impl.super__Rb_tree_header) {
        pCVar23 = (ClosedFileInputSource *)0x0;
      }
      else {
        ppCVar25 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)&local_210,&pQVar33->filename);
        pCVar23 = *ppCVar25;
        ClosedFileInputSource::stayOpen(pCVar23,true);
      }
      QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
                ((QPDFPageLabelDocumentHelper *)&local_430,pQVar33->qpdf);
      local_468 = (QPDFPageData *)
                  get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                     *)&local_c0,pQVar33->qpdf);
      bVar18 = QPDFPageLabelDocumentHelper::hasPageLabels((QPDFPageLabelDocumentHelper *)&local_430)
      ;
      uVar39 = uVar39 & 0xff;
      if (bVar18) {
        uVar39 = 1;
      }
      local_388._8_8_ = 0;
      pcStack_370 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                    ::_M_invoke;
      local_378 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                  ::_M_manager;
      local_388._M_unused._0_8_ = (undefined8)pQVar33;
      doIfVerbose(local_4d8,
                  (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_388);
      local_478 = (pointer)CONCAT44(local_478._4_4_,uVar39);
      local_458 = pCVar23;
      if (local_378 != (code *)0x0) {
        (*local_378)(&local_388,&local_388,__destroy_functor);
      }
      pQVar38 = (QPDFPageData *)
                (pQVar33->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_460 = (QPDFPageData *)
                  (pQVar33->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (pQVar38 != local_460) {
        lVar41 = (long)(int)lVar41;
        do {
          start_idx = (long)*(int *)&(pQVar38->filename)._M_dataplus._M_p + -1;
          local_4dc = (int)start_idx;
          QPDFPageLabelDocumentHelper::getLabelsForPageRange
                    ((QPDFPageLabelDocumentHelper *)&local_430,start_idx,start_idx,lVar41,&local_2c8
                    );
          if (local_4dc < 0) {
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(local_4dc);
          }
          uVar30 = (ulong)local_4dc;
          pQVar11 = (pQVar33->orig_pages).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(pQVar33->orig_pages).
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pQVar11 >> 4) <=
              uVar30) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          local_318.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = pQVar11[uVar30].super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_318.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&pQVar11[uVar30].super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
          if (local_318.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_318.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_318.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_318.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_318.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528,&local_318);
          if (local_318.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_318.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)local_528._8_8_;
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_3a8 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_4d0);
          if ((QPDFObjGen)
              local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          local_3e0 = QPDF::getUniqueId(pQVar33->qpdf);
          this_03 = &std::
                     map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                   *)&local_60,&local_3e0)->_M_t;
          cVar34 = std::
                   _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   ::find(this_03,&local_3a8);
          if ((_Rb_tree_header *)cVar34._M_node == &(this_03->_M_impl).super__Rb_tree_header) {
            this_04 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                       *)std::
                         map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                         ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                       *)&local_60,&local_3e0);
            std::
            _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
            ::_M_insert_unique<QPDFObjGen_const&>(this_04,&local_3a8);
            pmVar28 = std::
                      map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                      ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                    *)&local_90,&local_3e0);
            if (*pmVar28 == true) {
              QPDFPageObjectHelper::removeUnreferencedResources((QPDFPageObjectHelper *)local_528);
            }
          }
          else {
            QPDFPageObjectHelper::shallowCopyPage
                      ((QPDFPageObjectHelper *)&local_4d0,(QPDFPageObjectHelper *)local_528);
            local_528._8_8_ =
                 local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_518._M_allocated_capacity,
                       &local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            local_518._8_8_ =
                 local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_508,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
            local_500 = (element_type *)
                        local_4d0.m.
                        super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_4f8,
                       &local_4d0.m.
                        super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&local_4d0);
          }
          local_1a8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_528._8_8_;
          local_1a8.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_1a8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._8_8_;
          local_1a8.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_508._M_pi;
          if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            }
          }
          local_1a8.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
          local_1a8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_500;
          local_1a8.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_4f8._M_pi;
          if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            }
          }
          QPDFPageDocumentHelper::addPage(&local_230,&local_1a8,false);
          QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1a8);
          pQVar12 = (QPDFObjectHandle *)pQVar33->qpdf;
          if (pQVar12 == local_4e8) {
            p_Var29 = &local_2f8._M_impl.super__Rb_tree_header._M_header;
            for (p_Var35 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var35 != (_Rb_tree_header *)0x0;
                p_Var35 = (&p_Var35->_M_left)[(int)*(size_t *)(p_Var35 + 1) < local_4dc]) {
              if (local_4dc <= (int)*(size_t *)(p_Var35 + 1)) {
                p_Var29 = p_Var35;
              }
            }
            p_Var47 = &local_2f8._M_impl.super__Rb_tree_header;
            p_Var37 = p_Var47;
            if (((_Rb_tree_header *)p_Var29 != p_Var47) &&
               (p_Var37 = (_Rb_tree_header *)p_Var29,
               local_4dc < (int)((_Rb_tree_header *)p_Var29)->_M_node_count)) {
              p_Var37 = p_Var47;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_2f8,&local_4dc);
            bVar18 = p_Var37 == &local_2f8._M_impl.super__Rb_tree_header;
          }
          else {
            bVar18 = false;
          }
          local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_528._8_8_;
          local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
          if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_518._M_allocated_capacity + 8) =
                   *(int *)(local_518._M_allocated_capacity + 8) + 1;
            }
          }
          local_278.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_518._8_8_;
          local_278.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_508._M_pi;
          if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            }
          }
          local_278.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
          local_278.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_500;
          local_278.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_4f8._M_pi;
          if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            }
          }
          local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)
               local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((QPDFObjGen)
              local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (QPDFObjGen)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 8) =
                   *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 8) =
                   *(int *)((long)local_278.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 8) + 1;
            }
          }
          added_page((QPDF *)&local_3b8,local_4e8);
          if ((QPDFObjGen)
              local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0)
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_278);
          if (pQVar12 == local_4e8) {
            if (!bVar18) goto LAB_00173478;
          }
          else {
            bVar19 = QPDFAcroFormDocumentHelper::hasAcroForm
                               ((QPDFAcroFormDocumentHelper *)local_468);
            if (bVar19 || !bVar18) {
LAB_00173478:
              local_328.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_3b8;
              local_328.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   local_3b0;
              if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
                }
              }
              local_338.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_528._8_8_;
              local_338.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
              if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_518._M_allocated_capacity + 8) =
                       *(int *)(local_518._M_allocated_capacity + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_518._M_allocated_capacity + 8) =
                       *(int *)(local_518._M_allocated_capacity + 8) + 1;
                }
              }
              QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                        ((QPDFAcroFormDocumentHelper *)local_470,&local_328,&local_338,
                         (QPDFAcroFormDocumentHelper *)local_468,
                         (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                         &local_f0);
              if ((QPDFObjGen)
                  local_338.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (QPDFObjGen)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_338.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if (local_328.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_328.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
          }
          if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
          }
          lVar41 = lVar41 + 1;
          QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528);
          pQVar38 = (QPDFPageData *)((long)&(pQVar38->filename)._M_dataplus._M_p + 4);
        } while (pQVar38 != local_460);
      }
      pQVar42 = local_478;
      uVar39 = (uint)local_478;
      if (local_458 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(local_458,false);
      }
      QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
                ((QPDFPageLabelDocumentHelper *)&local_430);
      pQVar33 = pQVar33 + 1;
    } while (pQVar33 != local_3e8);
    if (((ulong)pQVar42 & 1) != 0) {
      QPDFObjectHandle::newDictionary();
      local_528._0_8_ = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Nums","");
      QPDFObjectHandle::newArray((QPDFObjectHandle *)&local_430,&local_2c8);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_4d0,(string *)local_528,(QPDFObjectHandle *)&local_430);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
      }
      QPDF::getRoot((QPDF *)&local_430);
      local_528._0_8_ = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/PageLabels","");
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_430,(string *)local_528,(QPDFObjectHandle *)&local_4d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._0_8_ != &local_518) {
        operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length);
      }
      if ((QPDFObjGen)
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
  }
  if (local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar30 = 0;
    do {
      p_Var47 = &local_2f8._M_impl.super__Rb_tree_header;
      local_528._8_8_ =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar30].super_QPDFObjectHelper.super_BaseHandle
           .obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      QVar45 = (QPDFObjGen)
               local_3a0.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar30].super_QPDFObjectHelper.
               super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      local_518._M_allocated_capacity._0_4_ = QVar45.obj;
      local_518._M_allocated_capacity._4_4_ = QVar45.gen;
      if (QVar45 != (QPDFObjGen)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)QVar45 + 8) = *(int *)((long)QVar45 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)QVar45 + 8) = *(int *)((long)QVar45 + 8) + 1;
        }
      }
      local_518._8_8_ =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar30].super_QPDFObjectHelper.oh_.
           super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_508._M_pi =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar30].super_QPDFObjectHelper.oh_.
           super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_508._M_pi)->_M_parent + 1;
        }
      }
      local_528._0_8_ = &PTR__QPDFPageObjectHelper_002ef088;
      local_500 = local_3a0.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar30].m.
                  super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_4f8._M_pi =
           local_3a0.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar30].m.
           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
        }
      }
      if (uVar30 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar30);
      }
      iVar20 = (int)uVar30;
      p_Var35 = &p_Var47->_M_header;
      for (p_Var29 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var29 != (_Base_ptr)0x0;
          p_Var29 = (&p_Var29->_M_left)[(int)p_Var29[1]._M_color < iVar20]) {
        if (iVar20 <= (int)p_Var29[1]._M_color) {
          p_Var35 = p_Var29;
        }
      }
      p_Var29 = &p_Var47->_M_header;
      if (((_Rb_tree_header *)p_Var35 != p_Var47) &&
         (p_Var29 = p_Var35, iVar20 < (int)p_Var35[1]._M_color)) {
        p_Var29 = &p_Var47->_M_header;
      }
      if ((_Rb_tree_header *)p_Var29 == p_Var47) {
        local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)local_528._8_8_;
        local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_518._M_allocated_capacity;
        if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
          }
        }
        QVar45 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_4d0);
        QPDFObjectHandle::newNull();
        QPDF::replaceObject((QPDF *)local_4e8,QVar45,&local_240);
        if (local_240.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_240.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((QPDFObjGen)
            local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        local_1e0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_528._8_8_;
        local_1e0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_allocated_capacity;
        if ((QPDFObjGen)local_518._M_allocated_capacity != (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_518._M_allocated_capacity + 8) =
                 *(int *)(local_518._M_allocated_capacity + 8) + 1;
          }
        }
        local_1e0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_518._8_8_;
        local_1e0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_508._M_pi;
        if ((_Base_ptr)local_508._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_508._M_pi)->_M_use_count = (local_508._M_pi)->_M_use_count + 1;
          }
        }
        local_1e0.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)&PTR__QPDFPageObjectHelper_002ef088;
        local_1e0.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_500;
        local_1e0.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_4f8._M_pi;
        if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4f8._M_pi)->_M_use_count = (local_4f8._M_pi)->_M_use_count + 1;
          }
        }
        QPDFAcroFormDocumentHelper::getFormFieldsForPage
                  ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                   &local_430,(QPDFAcroFormDocumentHelper *)local_470,&local_1e0);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1e0);
        sVar15 = local_430._M_string_length;
        for (_Var43._M_p = local_430._M_dataplus._M_p; _Var43._M_p != (pointer)sVar15;
            _Var43._M_p = (pointer)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)_Var43._M_p + 0x30))->_M_use_count) {
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var43._M_p)->_M_use_count;
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var43._M_p)->_M_weak_count;
          local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var43._M_p + 0x10))->
               _vptr__Sp_counted_base;
          if (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var43._M_p + 0x10))->
                 _M_use_count;
          local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var43._M_p + 0x20))->
               _vptr__Sp_counted_base;
          if (local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_4d0.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)&PTR__QPDFFormFieldObjectHelper_002ef018;
          local_4d0.m.
          super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = *(element_type **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var43._M_p + 0x20))->
                   _M_use_count;
          local_4d0.m.
          super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var43._M_p + 0x30))->
               _vptr__Sp_counted_base;
          if (local_4d0.m.
              super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4d0.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4d0.m.
                    super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4d0.m.
               super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4d0.m.
                    super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          if (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_450[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_450[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_410[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)QPDFObjectHandle::getObjGen(local_450);
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>(&local_f0,(QPDFObjGen *)local_410);
          if (local_450[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_450[0].super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_4d0);
        }
        std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
                  ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                   &local_430);
      }
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_528);
      uVar30 = uVar30 + 1;
    } while (uVar30 < (ulong)(((long)local_3a0.
                                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_3a0.
                                     super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  bVar18 = QPDFAcroFormDocumentHelper::hasAcroForm((QPDFAcroFormDocumentHelper *)local_470);
  if (bVar18) {
    QPDF::getRoot((QPDF *)&local_4d0);
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/AcroForm","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_430,(string *)&local_4d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
    }
    if ((QPDFObjGen)
        local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    local_528._0_8_ = &local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Fields","");
    QPDFObjectHandle::getKey(local_450,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._0_8_ != &local_518) {
      operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
    }
    bVar18 = QPDFObjectHandle::isArray(local_450);
    if (bVar18) {
      QPDFObjectHandle::newArray();
      bVar18 = QPDFObjectHandle::isIndirect(local_450);
      if (bVar18) {
        local_348 = (QPDFObjGen)
                    local_410[0].super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_340 = (QPDFObjGen)
                    local_410[0].super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((QPDFObjGen)
            local_410[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)local_410[0].super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 8) =
                 *(int *)((long)local_410[0].super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)local_410[0].super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 8) =
                 *(int *)((long)local_410[0].super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 8) + 1;
          }
        }
        QPDF::makeIndirectObject((QPDF *)local_528,local_4e8);
        this_01._M_pi =
             local_410[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_410[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_;
        local_410[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_528._0_8_;
        local_528._0_4_ = 0;
        local_528._4_4_ = 0;
        local_528._8_4_ = 0;
        local_528._12_4_ = 0;
        if ((QPDFObjGen)this_01._M_pi != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        if ((QPDFObjGen)local_528._8_8_ != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_);
        }
        if (local_340 != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340);
        }
      }
      QPDFObjectHandle::aitems(local_450);
      QPDFObjectHandle::QPDFArrayItems::begin((iterator *)local_528,local_3d8);
      QPDFObjectHandle::QPDFArrayItems::end((iterator *)&local_4d0,local_3d8);
      while (bVar18 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                                ((iterator *)local_528,(iterator *)&local_4d0), !bVar18) {
        this_05 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_528);
        local_3b8 = QPDFObjectHandle::getObjGen(this_05);
        cVar34 = std::
                 _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 ::find(&local_f0,&local_3b8);
        if ((_Rb_tree_header *)cVar34._M_node != &local_f0._M_impl.super__Rb_tree_header) {
          QPDFObjectHandle::appendItem(local_410,this_05);
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_528);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_4d0);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_528);
      if (local_3d8[0].oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3d8[0].oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      iVar20 = QPDFObjectHandle::getArrayNItems(local_410);
      if (iVar20 < 1) {
        QPDF::getRoot((QPDF *)&local_4d0);
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/AcroForm","");
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_4d0,(string *)local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
        }
        if ((QPDFObjGen)
            local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_4d0.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        local_528._0_8_ = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"/Fields","");
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_430,(string *)local_528,local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._0_8_ != &local_518) {
          operator_delete((void *)local_528._0_8_,(ulong)(local_518._M_allocated_capacity + 1));
        }
      }
      if ((QPDFObjGen)
          local_410[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_410[0].super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if (local_450[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_450[0].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430._M_string_length);
    }
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_2c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2f8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_3a0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_230);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ::~vector(&local_498);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  ::~_Rb_tree(&local_210);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  ::~_Rb_tree(&local_2a8);
  return;
}

Assistant:

void
QPDFJob::handlePageSpecs(QPDF& pdf, std::vector<std::unique_ptr<QPDF>>& page_heap)
{
    // Parse all page specifications and translate them into lists of actual pages.

    // Handle "." as a shortcut for the input file
    for (auto& page_spec: m->page_specs) {
        if (page_spec.filename == ".") {
            page_spec.filename = m->infilename.get();
        }
        if (page_spec.range.empty()) {
            page_spec.range = "1-z";
        }
    }

    if (!m->keep_files_open_set) {
        // Count the number of distinct files to determine whether we should keep files open or not.
        // Rather than trying to code some portable heuristic based on OS limits, just hard-code
        // this at a given number and allow users to override.
        std::set<std::string> filenames;
        for (auto& page_spec: m->page_specs) {
            filenames.insert(page_spec.filename);
        }
        m->keep_files_open = (filenames.size() <= m->keep_files_open_threshold);
        QTC::TC("qpdf", "QPDFJob automatically set keep files open", m->keep_files_open ? 0 : 1);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": selecting --keep-open-files=" << (m->keep_files_open ? "y" : "n")
              << "\n";
        });
    }

    // Create a QPDF object for each file that we may take pages from.
    std::map<std::string, QPDF*> page_spec_qpdfs;
    std::map<std::string, ClosedFileInputSource*> page_spec_cfis;
    page_spec_qpdfs[m->infilename.get()] = &pdf;
    std::vector<QPDFPageData> parsed_specs;
    std::map<unsigned long long, std::set<QPDFObjGen>> copied_pages;
    for (auto& page_spec: m->page_specs) {
        if (page_spec_qpdfs.count(page_spec.filename) == 0) {
            // Open the PDF file and store the QPDF object. Throw a std::shared_ptr to the qpdf into
            // a heap so that it survives through copying to the output but gets cleaned up
            // automatically at the end. Do not canonicalize the file name. Using two different
            // paths to refer to the same file is a documented workaround for duplicating a page. If
            // you are using this an example of how to do this with the API, you can just create two
            // different QPDF objects to the same underlying file with the same path to achieve the
            // same effect.
            char const* password = page_spec.password.get();
            if ((!m->encryption_file.empty()) && (password == nullptr) &&
                (page_spec.filename == m->encryption_file)) {
                QTC::TC("qpdf", "QPDFJob pages encryption password");
                password = m->encryption_file_password.get();
            }
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": processing " << page_spec.filename << "\n";
            });
            std::shared_ptr<InputSource> is;
            ClosedFileInputSource* cis = nullptr;
            if (!m->keep_files_open) {
                QTC::TC("qpdf", "QPDFJob keep files open n");
                cis = new ClosedFileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(cis);
                cis->stayOpen(true);
            } else {
                QTC::TC("qpdf", "QPDFJob keep files open y");
                FileInputSource* fis = new FileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(fis);
            }
            std::unique_ptr<QPDF> qpdf_sp;
            processInputSource(qpdf_sp, is, password, true);
            page_spec_qpdfs[page_spec.filename] = qpdf_sp.get();
            page_heap.push_back(std::move(qpdf_sp));
            if (cis) {
                cis->stayOpen(false);
                page_spec_cfis[page_spec.filename] = cis;
            }
        }

        // Read original pages from the PDF, and parse the page range associated with this
        // occurrence of the file.
        parsed_specs.emplace_back(
            page_spec.filename, page_spec_qpdfs[page_spec.filename], page_spec.range);
    }

    std::map<unsigned long long, bool> remove_unreferenced;
    if (m->remove_unreferenced_page_resources != QPDFJob::re_no) {
        for (auto const& iter: page_spec_qpdfs) {
            std::string const& filename = iter.first;
            ClosedFileInputSource* cis = nullptr;
            if (page_spec_cfis.count(filename)) {
                cis = page_spec_cfis[filename];
                cis->stayOpen(true);
            }
            QPDF& other(*(iter.second));
            auto other_uuid = other.getUniqueId();
            if (remove_unreferenced.count(other_uuid) == 0) {
                remove_unreferenced[other_uuid] = shouldRemoveUnreferencedResources(other);
            }
            if (cis) {
                cis->stayOpen(false);
            }
        }
    }

    // Clear all pages out of the primary QPDF's pages tree but leave the objects in place in the
    // file so they can be re-added without changing their object numbers. This enables other things
    // in the original file, such as outlines, to continue to work.
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": removing unreferenced pages from primary input\n";
    });
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> orig_pages = dh.getAllPages();
    for (auto const& page: orig_pages) {
        dh.removePage(page);
    }

    auto n_collate = m->collate.size();
    auto n_specs = parsed_specs.size();
    if (!(n_collate == 0 || n_collate == 1 || n_collate == n_specs)) {
        usage(
            "--pages: if --collate has more than one value, it must have one value per page "
            "specification");
    }
    if (n_collate > 0 && n_specs > 1) {
        // Collate the pages by selecting one page from each spec in order. When a spec runs out of
        // pages, stop selecting from it.
        std::vector<QPDFPageData> new_parsed_specs;
        // Make sure we have a collate value for each spec. We have already checked that a non-empty
        // collate has either one value or one value per spec.
        for (auto i = n_collate; i < n_specs; ++i) {
            m->collate.push_back(m->collate.at(0));
        }
        std::vector<size_t> cur_page(n_specs, 0);
        bool got_pages = true;
        while (got_pages) {
            got_pages = false;
            for (size_t i = 0; i < n_specs; ++i) {
                QPDFPageData& page_data = parsed_specs.at(i);
                for (size_t j = 0; j < m->collate.at(i); ++j) {
                    if (cur_page.at(i) + j < page_data.selected_pages.size()) {
                        got_pages = true;
                        new_parsed_specs.emplace_back(
                            page_data, page_data.selected_pages.at(cur_page.at(i) + j));
                    }
                }
                cur_page.at(i) += m->collate.at(i);
            }
        }
        parsed_specs = new_parsed_specs;
    }

    // Add all the pages from all the files in the order specified. Keep track of any pages from the
    // original file that we are selecting.
    std::set<int> selected_from_orig;
    std::vector<QPDFObjectHandle> new_labels;
    bool any_page_labels = false;
    int out_pageno = 0;
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh_map;
    auto this_afdh = get_afdh_for_qpdf(afdh_map, &pdf);
    std::set<QPDFObjGen> referenced_fields;
    for (auto& page_data: parsed_specs) {
        ClosedFileInputSource* cis = nullptr;
        if (page_spec_cfis.count(page_data.filename)) {
            cis = page_spec_cfis[page_data.filename];
            cis->stayOpen(true);
        }
        QPDFPageLabelDocumentHelper pldh(*page_data.qpdf);
        auto other_afdh = get_afdh_for_qpdf(afdh_map, page_data.qpdf);
        if (pldh.hasPageLabels()) {
            any_page_labels = true;
        }
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": adding pages from " << page_data.filename << "\n";
        });
        for (auto pageno_iter: page_data.selected_pages) {
            // Pages are specified from 1 but numbered from 0 in the vector
            int pageno = pageno_iter - 1;
            pldh.getLabelsForPageRange(pageno, pageno, out_pageno++, new_labels);
            QPDFPageObjectHelper to_copy = page_data.orig_pages.at(QIntC::to_size(pageno));
            QPDFObjGen to_copy_og = to_copy.getObjectHandle().getObjGen();
            unsigned long long from_uuid = page_data.qpdf->getUniqueId();
            if (copied_pages[from_uuid].count(to_copy_og)) {
                QTC::TC(
                    "qpdf",
                    "QPDFJob copy same page more than once",
                    (page_data.qpdf == &pdf) ? 0 : 1);
                to_copy = to_copy.shallowCopyPage();
            } else {
                copied_pages[from_uuid].insert(to_copy_og);
                if (remove_unreferenced[from_uuid]) {
                    to_copy.removeUnreferencedResources();
                }
            }
            dh.addPage(to_copy, false);
            bool first_copy_from_orig = false;
            bool this_file = (page_data.qpdf == &pdf);
            if (this_file) {
                // This is a page from the original file. Keep track of the fact that we are using
                // it.
                first_copy_from_orig = (selected_from_orig.count(pageno) == 0);
                selected_from_orig.insert(pageno);
            }
            auto new_page = added_page(pdf, to_copy);
            // Try to avoid gratuitously renaming fields. In the case of where we're just extracting
            // a bunch of pages from the original file and not copying any page more than once,
            // there's no reason to do anything with the fields. Since we don't remove fields from
            // the original file until all copy operations are completed, any foreign pages that
            // conflict with original pages will be adjusted. If we copy any page from the original
            // file more than once, that page would be in conflict with the previous copy of itself.
            if ((!this_file && other_afdh->hasAcroForm()) || !first_copy_from_orig) {
                if (!this_file) {
                    QTC::TC("qpdf", "QPDFJob copy fields not this file");
                } else if (!first_copy_from_orig) {
                    QTC::TC("qpdf", "QPDFJob copy fields non-first from orig");
                }
                try {
                    this_afdh->fixCopiedAnnotations(
                        new_page, to_copy.getObjectHandle(), *other_afdh, &referenced_fields);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug. " +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (cis) {
            cis->stayOpen(false);
        }
    }
    if (any_page_labels) {
        QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(new_labels));
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }

    // Delete page objects for unused page in primary. This prevents those objects from being
    // preserved by being referred to from other places, such as the outlines dictionary. Also make
    // sure we keep form fields from pages we preserved.
    for (size_t pageno = 0; pageno < orig_pages.size(); ++pageno) {
        auto page = orig_pages.at(pageno);
        if (selected_from_orig.count(QIntC::to_int(pageno))) {
            for (auto field: this_afdh->getFormFieldsForPage(page)) {
                QTC::TC("qpdf", "QPDFJob pages keeping field from original");
                referenced_fields.insert(field.getObjectHandle().getObjGen());
            }
        } else {
            pdf.replaceObject(page.getObjectHandle().getObjGen(), QPDFObjectHandle::newNull());
        }
    }
    // Remove unreferenced form fields
    if (this_afdh->hasAcroForm()) {
        auto acroform = pdf.getRoot().getKey("/AcroForm");
        auto fields = acroform.getKey("/Fields");
        if (fields.isArray()) {
            auto new_fields = QPDFObjectHandle::newArray();
            if (fields.isIndirect()) {
                new_fields = pdf.makeIndirectObject(new_fields);
            }
            for (auto const& field: fields.aitems()) {
                if (referenced_fields.count(field.getObjGen())) {
                    new_fields.appendItem(field);
                }
            }
            if (new_fields.getArrayNItems() > 0) {
                QTC::TC("qpdf", "QPDFJob keep some fields in pages");
                acroform.replaceKey("/Fields", new_fields);
            } else {
                QTC::TC("qpdf", "QPDFJob no more fields in pages");
                pdf.getRoot().removeKey("/AcroForm");
            }
        }
    }
}